

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_encode_tiles_mt(AV1_COMP *cpi)

{
  uint uVar1;
  uint num_workers;
  AVxWorker *pAVar2;
  int iVar3;
  AVxWorkerInterface *pAVar4;
  AVxWorker *pAVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar1 = (cpi->mt_info).num_mod_workers[4];
  if (cpi->allocated_tiles < (cpi->common).tiles.rows * (cpi->common).tiles.cols) {
    av1_alloc_tile_data(cpi);
  }
  av1_init_tile_data(cpi);
  num_workers = (cpi->mt_info).num_workers;
  if ((int)uVar1 < (int)num_workers) {
    num_workers = uVar1;
  }
  prepare_enc_workers(cpi,enc_worker_hook,num_workers);
  pAVar4 = aom_get_worker_interface();
  uVar6 = (ulong)num_workers;
  if (0 < (int)num_workers) {
    lVar9 = uVar6 + 1;
    lVar7 = uVar6 * 0x38;
    do {
      pAVar5 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar5[-1].had_error + lVar7) = 0;
      pAVar5 = (AVxWorker *)((long)&pAVar5[-1].impl_ + lVar7);
      if (lVar9 == 2) {
        (*pAVar4->execute)(pAVar5);
      }
      else {
        (*pAVar4->launch)(pAVar5);
      }
      lVar9 = lVar9 + -1;
      lVar7 = lVar7 + -0x38;
    } while (1 < lVar9);
  }
  pAVar4 = aom_get_worker_interface();
  pAVar5 = (cpi->mt_info).workers;
  iVar8 = pAVar5->had_error;
  if (iVar8 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar5->data1 + 0x18),0x1a0);
  }
  if (1 < (int)num_workers) {
    lVar7 = uVar6 + 1;
    lVar9 = uVar6 * 0x38;
    do {
      pAVar2 = (cpi->mt_info).workers;
      iVar3 = (*pAVar4->sync)((AVxWorker *)((long)&pAVar2[-1].impl_ + lVar9));
      if (iVar3 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar2[-1].data1 + lVar9) + 0x18),0x1a0);
        iVar8 = 1;
      }
      lVar7 = lVar7 + -1;
      lVar9 = lVar9 + -0x38;
    } while (2 < lVar7);
  }
  if (iVar8 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar5->data1 + 8) + 0x2b90) = (cpi->common).error;
  accumulate_counters_enc_workers(cpi,num_workers);
  return;
}

Assistant:

void av1_encode_tiles_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  assert(IMPLIES(cpi->tile_data == NULL,
                 cpi->allocated_tiles < tile_cols * tile_rows));
  if (cpi->allocated_tiles < tile_cols * tile_rows) av1_alloc_tile_data(cpi);

  av1_init_tile_data(cpi);
  num_workers = AOMMIN(num_workers, mt_info->num_workers);

  prepare_enc_workers(cpi, enc_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  accumulate_counters_enc_workers(cpi, num_workers);
}